

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::toDimacs(Solver *this,FILE *f,vec<Gluco::Lit> *assumps)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  Var VVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int x;
  Clause *c;
  ulong uVar12;
  long lVar13;
  Var max;
  uint local_54;
  ulong local_50;
  vec<int> local_48;
  FILE *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_48.data = (int *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_54 = 0;
  local_50 = (ulong)(this->clauses).sz;
  if ((long)local_50 < 1) {
    iVar10 = 0;
    uVar12 = 0;
  }
  else {
    puVar3 = (this->clauses).data;
    puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar11 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
    uVar12 = 0;
    iVar10 = 0;
    local_38 = (FILE *)f;
    do {
      uVar1 = puVar3[uVar12];
      if (uVar11 <= uVar1) goto LAB_005ca4c6;
      bVar5 = satisfied(this,(Clause *)(puVar4 + uVar1));
      iVar10 = iVar10 + (uint)!bVar5;
      uVar12 = uVar12 + 1;
    } while (local_50 != uVar12);
    if ((int)local_50 < 1) {
      uVar12 = 0;
      f = (FILE *)local_38;
    }
    else {
      lVar9 = 0;
      do {
        uVar11 = (this->clauses).data[lVar9];
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar11) goto LAB_005ca4c6;
        c = (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar11);
        bVar5 = satisfied(this,c);
        if ((!bVar5) && (lVar7 = *(long *)&c->header, 0 < (int)((ulong)lVar7 >> 0x20))) {
          lVar13 = 0;
          do {
            iVar2 = *(int *)(&c[1].header.field_0x0 + lVar13 * 4);
            x = iVar2 >> 1;
            if (((byte)iVar2 & 1 ^ (this->assigns).data[x].value) != 1) {
              mapVar(x,&local_48,(Var *)&local_54);
              lVar7 = *(long *)&c->header;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < lVar7 >> 0x20);
          local_50 = (ulong)(uint)(this->clauses).sz;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)local_50);
      uVar12 = (ulong)local_54;
      f = (FILE *)local_38;
    }
  }
  uVar11 = iVar10 + (this->assumptions).sz;
  fprintf((FILE *)f,"p cnf %d %d\n",uVar12,(ulong)uVar11);
  if (0 < (this->assumptions).sz) {
    lVar9 = 0;
    do {
      uVar1 = (this->assumptions).data[lVar9].x;
      if (((byte)uVar1 & 1 ^ (this->assigns).data[(int)uVar1 >> 1].value) == 1) {
        __assert_fail("value(assumptions[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                      ,0x55b,"void Gluco::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      VVar6 = mapVar((int)uVar1 >> 1,&local_48,(Var *)&local_54);
      pcVar8 = "-";
      if ((uVar1 & 1) == 0) {
        pcVar8 = "";
      }
      fprintf((FILE *)f,"%s%d 0\n",pcVar8,(ulong)(VVar6 + 1));
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->assumptions).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar9 = 0;
    do {
      uVar1 = (this->clauses).data[lVar9];
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar1) {
LAB_005ca4c6:
        __assert_fail("r >= 0 && r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                      ,0x42,
                      "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
        ;
      }
      toDimacs(this,f,(Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar1),
               &local_48,(Var *)&local_54);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote %d clauses with %d variables.\n",(ulong)uVar11,(ulong)local_54);
  }
  if (local_48.data != (int *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int i, cnt = 0;
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (i = 0; i < assumptions.size(); i++){
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max)+1);
    }

    for (i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}